

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.cpp
# Opt level: O2

bool gpt_params_parse(int argc,char **argv,gpt_params *params)

{
  bool bVar1;
  int iVar2;
  back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  this;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar3;
  FILE *pFVar4;
  long lVar5;
  float fVar6;
  istreambuf_iterator<char,_std::char_traits<char>_> __first;
  int local_29c;
  back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_298;
  uint local_28c;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_288;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_280;
  string arg;
  string local_258;
  ifstream file;
  uint auStack_218 [50];
  undefined8 auStack_150 [36];
  
  local_288 = &params->token_test;
  local_298.container = &params->prompt;
  local_280 = &params->model;
  local_29c = 1;
  do {
    if (argc <= local_29c) {
      return true;
    }
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&arg,argv[local_29c],(allocator<char> *)&file);
    bVar1 = std::operator==(&arg,"-s");
    if ((bVar1) || (bVar1 = std::operator==(&arg,"--seed"), bVar1)) {
      get_next_arg((string *)&file,&local_29c,argc,argv,&arg,params);
      iVar2 = std::__cxx11::stoi((string *)&file,(size_t *)0x0,10);
      params->seed = iVar2;
LAB_0010e3f0:
      std::__cxx11::string::~string((string *)&file);
LAB_0010e3f8:
      bVar1 = false;
    }
    else {
      bVar1 = std::operator==(&arg,"-t");
      if ((bVar1) || (bVar1 = std::operator==(&arg,"--threads"), bVar1)) {
        get_next_arg((string *)&file,&local_29c,argc,argv,&arg,params);
        iVar2 = std::__cxx11::stoi((string *)&file,(size_t *)0x0,10);
        params->n_threads = iVar2;
        goto LAB_0010e3f0;
      }
      bVar1 = std::operator==(&arg,"-p");
      if ((bVar1) || (bVar1 = std::operator==(&arg,"--prompt"), bVar1)) {
        get_next_arg((string *)&file,&local_29c,argc,argv,&arg,params);
        this.container = local_298.container;
        goto LAB_0010e4aa;
      }
      bVar1 = std::operator==(&arg,"-n");
      if ((bVar1) || (bVar1 = std::operator==(&arg,"--n_predict"), bVar1)) {
        get_next_arg((string *)&file,&local_29c,argc,argv,&arg,params);
        iVar2 = std::__cxx11::stoi((string *)&file,(size_t *)0x0,10);
        params->n_predict = iVar2;
        goto LAB_0010e3f0;
      }
      bVar1 = std::operator==(&arg,"-np");
      if ((bVar1) || (bVar1 = std::operator==(&arg,"--n_parallel"), bVar1)) {
        get_next_arg((string *)&file,&local_29c,argc,argv,&arg,params);
        iVar2 = std::__cxx11::stoi((string *)&file,(size_t *)0x0,10);
        params->n_parallel = iVar2;
        goto LAB_0010e3f0;
      }
      bVar1 = std::operator==(&arg,"--top_k");
      if (bVar1) {
        get_next_arg((string *)&file,&local_29c,argc,argv,&arg,params);
        iVar2 = std::__cxx11::stoi((string *)&file,(size_t *)0x0,10);
        params->top_k = iVar2;
        goto LAB_0010e3f0;
      }
      bVar1 = std::operator==(&arg,"--top_p");
      if (bVar1) {
        get_next_arg((string *)&file,&local_29c,argc,argv,&arg,params);
        fVar6 = std::__cxx11::stof((string *)&file,(size_t *)0x0);
        params->top_p = fVar6;
        goto LAB_0010e3f0;
      }
      bVar1 = std::operator==(&arg,"--temp");
      if (bVar1) {
        get_next_arg((string *)&file,&local_29c,argc,argv,&arg,params);
        fVar6 = std::__cxx11::stof((string *)&file,(size_t *)0x0);
        params->temp = fVar6;
        goto LAB_0010e3f0;
      }
      bVar1 = std::operator==(&arg,"--repeat-last-n");
      if (bVar1) {
        get_next_arg((string *)&file,&local_29c,argc,argv,&arg,params);
        iVar2 = std::__cxx11::stoi((string *)&file,(size_t *)0x0,10);
        params->repeat_last_n = iVar2;
        goto LAB_0010e3f0;
      }
      bVar1 = std::operator==(&arg,"--repeat-penalty");
      if (bVar1) {
        get_next_arg((string *)&file,&local_29c,argc,argv,&arg,params);
        fVar6 = std::__cxx11::stof((string *)&file,(size_t *)0x0);
        params->repeat_penalty = fVar6;
        goto LAB_0010e3f0;
      }
      bVar1 = std::operator==(&arg,"-b");
      if ((bVar1) || (bVar1 = std::operator==(&arg,"--batch_size"), bVar1)) {
        get_next_arg((string *)&file,&local_29c,argc,argv,&arg,params);
        iVar2 = std::__cxx11::stoi((string *)&file,(size_t *)0x0,10);
        params->n_batch = iVar2;
        goto LAB_0010e3f0;
      }
      bVar1 = std::operator==(&arg,"-c");
      if ((bVar1) || (bVar1 = std::operator==(&arg,"--context"), bVar1)) {
        get_next_arg((string *)&file,&local_29c,argc,argv,&arg,params);
        iVar2 = std::__cxx11::stoi((string *)&file,(size_t *)0x0,10);
        params->n_ctx = iVar2;
        goto LAB_0010e3f0;
      }
      bVar1 = std::operator==(&arg,"-ngl");
      if (((bVar1) || (bVar1 = std::operator==(&arg,"--gpu-layers"), bVar1)) ||
         (bVar1 = std::operator==(&arg,"--n-gpu-layers"), bVar1)) {
        get_next_arg((string *)&file,&local_29c,argc,argv,&arg,params);
        iVar2 = std::__cxx11::stoi((string *)&file,(size_t *)0x0,10);
        params->n_gpu_layers = iVar2;
        goto LAB_0010e3f0;
      }
      bVar1 = std::operator==(&arg,"--ignore-eos");
      if (bVar1) {
        params->ignore_eos = true;
        goto LAB_0010e3f8;
      }
      bVar1 = std::operator==(&arg,"-m");
      if ((bVar1) || (bVar1 = std::operator==(&arg,"--model"), bVar1)) {
        get_next_arg((string *)&file,&local_29c,argc,argv,&arg,params);
        this.container = local_280;
LAB_0010e4aa:
        std::__cxx11::string::operator=((string *)this.container,(string *)&file);
        goto LAB_0010e3f0;
      }
      bVar1 = std::operator==(&arg,"-i");
      if ((bVar1) || (bVar1 = std::operator==(&arg,"--interactive"), bVar1)) {
        params->interactive = true;
        goto LAB_0010e3f8;
      }
      bVar1 = std::operator==(&arg,"-ip");
      if ((bVar1) || (bVar1 = std::operator==(&arg,"--interactive-port"), bVar1)) {
        params->interactive = true;
        get_next_arg((string *)&file,&local_29c,argc,argv,&arg,params);
        iVar2 = std::__cxx11::stoi((string *)&file,(size_t *)0x0,10);
        params->interactive_port = iVar2;
        goto LAB_0010e3f0;
      }
      pbVar3 = &arg;
      bVar1 = std::operator==(&arg,"-h");
      iVar2 = (int)pbVar3;
      if (bVar1) {
LAB_0010ea31:
        gpt_print_usage(iVar2,argv,params);
        exit(0);
      }
      pbVar3 = &arg;
      bVar1 = std::operator==(&arg,"--help");
      iVar2 = (int)pbVar3;
      if (bVar1) goto LAB_0010ea31;
      bVar1 = std::operator==(&arg,"-f");
      if ((!bVar1) && (bVar1 = std::operator==(&arg,"--file"), !bVar1)) {
        bVar1 = std::operator==(&arg,"-tt");
        if ((!bVar1) && (bVar1 = std::operator==(&arg,"--token_test"), !bVar1)) {
          pFVar4 = _stderr;
          fprintf(_stderr,"error: unknown argument: %s\n",arg._M_dataplus._M_p);
          iVar2 = (int)pFVar4;
          goto LAB_0010ea31;
        }
        get_next_arg((string *)&file,&local_29c,argc,argv,&arg,params);
        this.container = local_288;
        goto LAB_0010e4aa;
      }
      get_next_arg(&local_258,&local_29c,argc,argv,&arg,params);
      std::__cxx11::string::~string((string *)&local_258);
      lVar5 = (long)local_29c;
      std::ifstream::ifstream((string *)&file,argv[lVar5],_S_in);
      local_28c = *(uint *)((long)auStack_218 + *(long *)(_file + -0x18));
      if ((local_28c & 5) == 0) {
        __first._8_8_ = 0xffffffff;
        __first._M_sbuf = *(streambuf_type **)((long)auStack_150 + *(long *)(_file + -0x18));
        std::__copy_move<false,false,std::input_iterator_tag>::
        __copy_m<std::istreambuf_iterator<char,std::char_traits<char>>,std::back_insert_iterator<std::__cxx11::string>>
                  (__first,(istreambuf_iterator<char,_std::char_traits<char>_>)
                           (ZEXT816(0xffffffffffffffff) << 0x40),local_298);
        bVar1 = false;
        if ((params->prompt)._M_dataplus._M_p[(params->prompt)._M_string_length - 1] == '\n') {
          std::__cxx11::string::pop_back();
        }
      }
      else {
        fprintf(_stderr,"error: failed to open file \'%s\'\n",argv[lVar5]);
        bVar1 = true;
      }
      std::ifstream::~ifstream((string *)&file);
      if ((local_28c & 5) == 0) goto LAB_0010e3f8;
    }
    std::__cxx11::string::~string((string *)&arg);
    if (bVar1) {
      return true;
    }
    local_29c = local_29c + 1;
  } while( true );
}

Assistant:

bool gpt_params_parse(int argc, char ** argv, gpt_params & params) {
    for (int i = 1; i < argc; i++) {
        std::string arg = argv[i];

        if (arg == "-s" || arg == "--seed") {
            params.seed = std::stoi(get_next_arg(i, argc, argv, arg, params));
        } else if (arg == "-t" || arg == "--threads") {
            params.n_threads = std::stoi(get_next_arg(i, argc, argv, arg, params));
        } else if (arg == "-p" || arg == "--prompt") {
            params.prompt = get_next_arg(i, argc, argv, arg, params);
        } else if (arg == "-n" || arg == "--n_predict") {
            params.n_predict = std::stoi(get_next_arg(i, argc, argv, arg, params));
        } else if (arg == "-np" || arg == "--n_parallel") {
            params.n_parallel = std::stoi(get_next_arg(i, argc, argv, arg, params));
        } else if (arg == "--top_k") {
            params.top_k = std::stoi(get_next_arg(i, argc, argv, arg, params));
        } else if (arg == "--top_p") {
            params.top_p = std::stof(get_next_arg(i, argc, argv, arg, params));
        } else if (arg == "--temp") {
            params.temp = std::stof(get_next_arg(i, argc, argv, arg, params));
        } else if (arg == "--repeat-last-n") {
            params.repeat_last_n = std::stoi(get_next_arg(i, argc, argv, arg, params));
        } else if (arg == "--repeat-penalty") {
            params.repeat_penalty = std::stof(get_next_arg(i, argc, argv, arg, params));
        } else if (arg == "-b" || arg == "--batch_size") {
            params.n_batch= std::stoi(get_next_arg(i, argc, argv, arg, params));
        } else if (arg == "-c" || arg == "--context") {
            params.n_ctx= std::stoi(get_next_arg(i, argc, argv, arg, params));
        } else if (arg == "-ngl" || arg == "--gpu-layers" || arg == "--n-gpu-layers") {
            params.n_gpu_layers = std::stoi(get_next_arg(i, argc, argv, arg, params));
        } else if (arg == "--ignore-eos") {
            params.ignore_eos = true;
        } else if (arg == "-m" || arg == "--model") {
            params.model = get_next_arg(i, argc, argv, arg, params);
        } else if (arg == "-i" || arg == "--interactive") {
            params.interactive = true;
        } else if (arg == "-ip" || arg == "--interactive-port") {
            params.interactive = true;
            params.interactive_port = std::stoi(get_next_arg(i, argc, argv, arg, params));
        } else if (arg == "-h" || arg == "--help") {
            gpt_print_usage(argc, argv, params);
            exit(0);
        } else if (arg == "-f" || arg == "--file") {
            get_next_arg(i, argc, argv, arg, params);
            std::ifstream file(argv[i]);
            if (!file) {
                fprintf(stderr, "error: failed to open file '%s'\n", argv[i]);
                break;
            }
            std::copy(std::istreambuf_iterator<char>(file), std::istreambuf_iterator<char>(), back_inserter(params.prompt));
            if (params.prompt.back() == '\n') {
                params.prompt.pop_back();
            }
        } else if (arg == "-tt" || arg == "--token_test") {
            params.token_test = get_next_arg(i, argc, argv, arg, params);
        }
        else {
            fprintf(stderr, "error: unknown argument: %s\n", arg.c_str());
            gpt_print_usage(argc, argv, params);
            exit(0);
        }
    }

    return true;
}